

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_property
          (t_netstd_generator *this,ostream *out,t_field *tfield,bool isPublic,bool generateIsset)

{
  allocator local_49;
  string local_48;
  undefined1 local_22;
  undefined1 local_21;
  bool generateIsset_local;
  t_field *ptStack_20;
  bool isPublic_local;
  t_field *tfield_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_22 = generateIsset;
  local_21 = isPublic;
  ptStack_20 = tfield;
  tfield_local = (t_field *)out;
  out_local = (ostream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"_",&local_49);
  generate_netstd_property(this,out,tfield,isPublic,generateIsset,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void t_netstd_generator::generate_property(ostream& out, t_field* tfield, bool isPublic, bool generateIsset)
{
    generate_netstd_property(out, tfield, isPublic, generateIsset, "_");
}